

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddItem
          (cmComputeLinkInformation *this,string *item,cmGeneratorTarget *tgt)

{
  bool bVar1;
  TargetType TVar2;
  string *config_00;
  ulong uVar3;
  bool local_122;
  bool local_121;
  bool local_101;
  undefined1 local_100 [8];
  string lib;
  ArtifactType artifact_1;
  bool implib;
  string *local_b8;
  string *libName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  bool local_81;
  undefined1 local_80 [8];
  string exe;
  ArtifactType artifact;
  undefined1 local_50 [8];
  string linkItem;
  bool impexe;
  string *config;
  cmGeneratorTarget *tgt_local;
  string *item_local;
  cmComputeLinkInformation *this_local;
  
  config_00 = &this->Config;
  local_101 = false;
  config = (string *)tgt;
  tgt_local = (cmGeneratorTarget *)item;
  item_local = (string *)this;
  if (tgt != (cmGeneratorTarget *)0x0) {
    local_101 = cmGeneratorTarget::IsExecutableWithExports(tgt);
  }
  linkItem.field_2._M_local_buf[0xf] = local_101;
  if (((local_101 == false) || ((this->UseImportLibrary & 1U) != 0)) ||
     (this->LoaderFlag != (char *)0x0)) {
    if ((config == (string *)0x0) ||
       (bVar1 = cmGeneratorTarget::IsLinkable((cmGeneratorTarget *)config), !bVar1)) {
      bVar1 = cmsys::SystemTools::FileIsFullPath((string *)tgt_local);
      if (bVar1) {
        bVar1 = cmsys::SystemTools::FileIsDirectory((string *)tgt_local);
        if (bVar1) {
          AddDirectoryItem(this,(string *)tgt_local);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->Depends,(value_type *)tgt_local);
          AddFullItem(this,(string *)tgt_local);
          AddLibraryRuntimeInfo(this,(string *)tgt_local);
        }
      }
      else {
        AddUserItem(this,(string *)tgt_local,true);
      }
    }
    else if (((linkItem.field_2._M_local_buf[0xf] & 1U) == 0) || (this->LoaderFlag == (char *)0x0))
    {
      TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)config);
      if (TVar2 == INTERFACE_LIBRARY) {
        std::__cxx11::string::string((string *)&local_a8);
        libName._7_1_ = 0;
        std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
        emplace_back<std::__cxx11::string,bool,cmGeneratorTarget_const*&>
                  ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                    *)this,&local_a8,(bool *)((long)&libName + 7),(cmGeneratorTarget **)&config);
        std::__cxx11::string::~string((string *)&local_a8);
        cmGeneratorTarget::GetImportedLibName
                  ((string *)&artifact_1,(cmGeneratorTarget *)config,config_00);
        local_b8 = (string *)&artifact_1;
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          AddItem(this,local_b8,(cmGeneratorTarget *)0x0);
        }
        std::__cxx11::string::~string((string *)&artifact_1);
      }
      else {
        TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)config);
        if (TVar2 != OBJECT_LIBRARY) {
          local_121 = false;
          if ((this->UseImportLibrary & 1U) != 0) {
            local_122 = true;
            if ((linkItem.field_2._M_local_buf[0xf] & 1U) == 0) {
              TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)config);
              local_122 = TVar2 == SHARED_LIBRARY;
            }
            local_121 = local_122;
          }
          lib.field_2._M_local_buf[0xf] = local_121;
          lib.field_2._8_4_ = ZEXT14(local_121 != false);
          cmGeneratorTarget::GetFullPath
                    ((string *)local_100,(cmGeneratorTarget *)config,config_00,lib.field_2._8_4_,
                     true);
          if (((this->LinkDependsNoShared & 1U) == 0) ||
             (TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)config),
             TVar2 != SHARED_LIBRARY)) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->Depends,(value_type *)local_100);
          }
          AddTargetItem(this,(string *)local_100,(cmGeneratorTarget *)config);
          AddLibraryRuntimeInfo(this,(string *)local_100,(cmGeneratorTarget *)config);
          std::__cxx11::string::~string((string *)local_100);
        }
      }
    }
    else {
      std::__cxx11::string::string((string *)local_50);
      std::__cxx11::string::operator=((string *)local_50,this->LoaderFlag);
      exe.field_2._8_4_ = this->UseImportLibrary & ImportLibraryArtifact;
      cmGeneratorTarget::GetFullPath
                ((string *)local_80,(cmGeneratorTarget *)config,config_00,exe.field_2._8_4_,true);
      std::__cxx11::string::operator+=((string *)local_50,(string *)local_80);
      local_81 = true;
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<std::__cxx11::string&,bool,cmGeneratorTarget_const*&>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50,&local_81,(cmGeneratorTarget **)&config);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Depends,(value_type *)local_80);
      std::__cxx11::string::~string((string *)local_80);
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddItem(std::string const& item,
                                       cmGeneratorTarget const* tgt)
{
  // Compute the proper name to use to link this library.
  const std::string& config = this->Config;
  bool impexe = (tgt && tgt->IsExecutableWithExports());
  if (impexe && !this->UseImportLibrary && !this->LoaderFlag) {
    // Skip linking to executables on platforms with no import
    // libraries or loader flags.
    return;
  }

  if (tgt && tgt->IsLinkable()) {
    // This is a CMake target.  Ask the target for its real name.
    if (impexe && this->LoaderFlag) {
      // This link item is an executable that may provide symbols
      // used by this target.  A special flag is needed on this
      // platform.  Add it now.
      std::string linkItem;
      linkItem = this->LoaderFlag;
      cmStateEnums::ArtifactType artifact = this->UseImportLibrary
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;

      std::string exe = tgt->GetFullPath(config, artifact, true);
      linkItem += exe;
      this->Items.emplace_back(linkItem, true, tgt);
      this->Depends.push_back(std::move(exe));
    } else if (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      // Add the interface library as an item so it can be considered as part
      // of COMPATIBLE_INTERFACE_ enforcement.  The generators will ignore
      // this for the actual link line.
      this->Items.emplace_back(std::string(), false, tgt);

      // Also add the item the interface specifies to be used in its place.
      std::string const& libName = tgt->GetImportedLibName(config);
      if (!libName.empty()) {
        this->AddItem(libName, nullptr);
      }
    } else if (tgt->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      // Ignore object library!
      // Its object-files should already have been extracted for linking.
    } else {
      // Decide whether to use an import library.
      bool implib =
        (this->UseImportLibrary &&
         (impexe || tgt->GetType() == cmStateEnums::SHARED_LIBRARY));
      cmStateEnums::ArtifactType artifact = implib
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;

      // Pass the full path to the target file.
      std::string lib = tgt->GetFullPath(config, artifact, true);
      if (!this->LinkDependsNoShared ||
          tgt->GetType() != cmStateEnums::SHARED_LIBRARY) {
        this->Depends.push_back(lib);
      }

      this->AddTargetItem(lib, tgt);
      this->AddLibraryRuntimeInfo(lib, tgt);
    }
  } else {
    // This is not a CMake target.  Use the name given.
    if (cmSystemTools::FileIsFullPath(item)) {
      if (cmSystemTools::FileIsDirectory(item)) {
        // This is a directory.
        this->AddDirectoryItem(item);
      } else {
        // Use the full path given to the library file.
        this->Depends.push_back(item);
        this->AddFullItem(item);
        this->AddLibraryRuntimeInfo(item);
      }
    } else {
      // This is a library or option specified by the user.
      this->AddUserItem(item, true);
    }
  }
}